

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::pointer> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::pointer>,_64UL,_cs_impl::default_allocator_provider>::
alloc<cs_impl::any>(allocator_type<cs_impl::any::holder<cs::pointer>,_64UL,_cs_impl::default_allocator_provider>
                    *this,any *args)

{
  size_t sVar1;
  holder<cs::pointer> *this_00;
  
  if ((this->mOffset == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<cs::pointer> *)operator_new(0x10);
  }
  else {
    sVar1 = this->mOffset;
    this->mOffset = sVar1 - 1;
    this_00 = this->mPool[sVar1 - 1];
  }
  cs_impl::any::holder<cs::pointer>::holder<cs_impl::any>(this_00,args);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}